

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O2

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Curl_addrinfo *pCVar5;
  sockaddr *__dest;
  char *pcVar6;
  size_t __n;
  Curl_addrinfo *pCVar7;
  addrinfo **__pai;
  Curl_addrinfo *cahead;
  Curl_addrinfo *pCVar8;
  addrinfo *aihead;
  
  *result = (Curl_addrinfo *)0x0;
  __pai = (addrinfo **)&aihead;
  iVar4 = getaddrinfo(nodename,servname,(addrinfo *)hints,__pai);
  if (iVar4 == 0) {
    cahead = (Curl_addrinfo *)0x0;
    pCVar7 = (Curl_addrinfo *)0x0;
    while( true ) {
      __n = 0x10;
      paVar1 = *__pai;
      if (paVar1 == (addrinfo *)0x0) break;
      pCVar5 = pCVar7;
      if (paVar1->ai_family == 2) {
LAB_0012f703:
        if ((paVar1->ai_addr != (sockaddr *)0x0) && ((uint)__n <= paVar1->ai_addrlen)) {
          pCVar5 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
          if (pCVar5 != (Curl_addrinfo *)0x0) {
            iVar4 = paVar1->ai_family;
            iVar2 = paVar1->ai_socktype;
            iVar3 = paVar1->ai_protocol;
            pCVar5->ai_flags = paVar1->ai_flags;
            pCVar5->ai_family = iVar4;
            pCVar5->ai_socktype = iVar2;
            pCVar5->ai_protocol = iVar3;
            pCVar5->ai_addrlen = (uint)__n;
            pCVar5->ai_canonname = (char *)0x0;
            pCVar5->ai_addr = (sockaddr *)0x0;
            pCVar5->ai_next = (Curl_addrinfo *)0x0;
            __dest = (sockaddr *)(*Curl_cmalloc)(__n);
            pCVar5->ai_addr = __dest;
            if (__dest != (sockaddr *)0x0) {
              memcpy(__dest,paVar1->ai_addr,__n);
              if (paVar1->ai_canonname != (char *)0x0) {
                pcVar6 = (*Curl_cstrdup)(paVar1->ai_canonname);
                pCVar5->ai_canonname = pcVar6;
                if (pcVar6 == (char *)0x0) {
                  (*Curl_cfree)(pCVar5->ai_addr);
                  goto LAB_0012f7c0;
                }
              }
              pCVar8 = pCVar5;
              if (cahead != (Curl_addrinfo *)0x0) {
                pCVar8 = cahead;
              }
              cahead = pCVar8;
              if (pCVar7 != (Curl_addrinfo *)0x0) {
                pCVar7->ai_next = pCVar5;
              }
              goto LAB_0012f713;
            }
LAB_0012f7c0:
            (*Curl_cfree)(pCVar5);
          }
          iVar4 = -10;
          goto LAB_0012f7d3;
        }
      }
      else if (paVar1->ai_family == 10) {
        __n = 0x1c;
        goto LAB_0012f703;
      }
LAB_0012f713:
      pCVar7 = pCVar5;
      __pai = &paVar1->ai_next;
    }
    iVar4 = 0;
LAB_0012f7d3:
    if (aihead != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)aihead);
    }
    if (paVar1 == (addrinfo *)0x0) {
      iVar4 = (uint)(cahead != (Curl_addrinfo *)0x0) * 2 + -2;
    }
    else {
      Curl_freeaddrinfo(cahead);
      cahead = (Curl_addrinfo *)0x0;
    }
    *result = cahead;
  }
  return iVar4;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(Curl_addrinfo));
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = malloc(ss_size);
    if(!ca->ai_addr) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      ca->ai_canonname = strdup(ai->ai_canonname);
      if(!ca->ai_canonname) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}